

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O2

Abc_Ntk_t *
Abc_NtkFromSopsInt(Abc_Ntk_t *pNtk,int nCubeLim,int nBTLimit,int nCostMax,int fCanon,int fReverse,
                  int fCnfShared,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int i;
  Gia_Man_t *p;
  Vec_Wec_t *vSupps;
  Gia_Obj_t *pObj;
  Vec_Int_t *pVVar4;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  char *__s2;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pAVar8;
  void *pvVar9;
  ulong uVar10;
  int iVar11;
  int iObjMax;
  
  iVar11 = fReverse;
  p = Abc_NtkClpGia(pNtk);
  vSupps = Gia_ManCreateCoSupps(p,fVerbose);
  if (0 < nCostMax && 0 < nCubeLim) {
    iVar1 = Gia_ManCoLargestSupp(p,vSupps);
    pObj = Gia_ManCo(p,iVar1);
    iObjMax = Gia_ObjId(p,pObj);
    pVVar4 = Vec_WecEntry(vSupps,iVar1);
    uVar3 = pVVar4->nSize;
    uVar2 = Gia_ManConeSize(p,&iObjMax,1);
    uVar10 = (ulong)(uint)nCubeLim * (long)(int)uVar2 * (long)(int)uVar3;
    if ((uint)nCostMax <= uVar10 && uVar10 - (uint)nCostMax != 0) {
      printf("Cost of the largest output cone exceeded the limit (%d * %d * %d  >  %d).\n",
             (ulong)uVar2,(ulong)uVar3);
      Gia_ManStop(p);
      Vec_WecFree(vSupps);
      return (Abc_Ntk_t *)0x0;
    }
  }
  pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  p_00 = Abc_GiaDeriveSops(pNtkNew,p,vSupps,nCubeLim,nBTLimit,iVar11,fCanon,fReverse,fCnfShared,
                           fVerbose);
  Gia_ManStop(p);
  if (p_00 == (Vec_Ptr_t *)0x0) {
    Vec_WecFree(vSupps);
    Abc_NtkDelete(pNtkNew);
    pNtkNew = (Abc_Ntk_t *)0x0;
  }
  else {
    for (iVar11 = 0; iVar11 < pNtk->vCos->nSize; iVar11 = iVar11 + 1) {
      pAVar5 = Abc_NtkCo(pNtk,iVar11);
      pAVar8 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
      uVar3 = *(uint *)&pAVar8->field_0x14 & 0xf;
      if ((uVar3 == 5) || (uVar3 == 2)) {
        pcVar6 = Abc_ObjName(pAVar5);
        __s2 = Abc_ObjName(pAVar8);
        iVar1 = strcmp(pcVar6,__s2);
        if (iVar1 != 0) {
          uVar3 = *(uint *)&pAVar8->field_0x14 & 0xf;
          goto LAB_0022a4fc;
        }
        pAVar5 = (pAVar5->field_6).pCopy;
        pAVar7 = (pAVar8->field_6).pCopy;
LAB_0022a558:
        Abc_ObjAddFanin(pAVar5,pAVar7);
      }
      else {
LAB_0022a4fc:
        if ((uVar3 == 5) || (uVar3 == 2)) {
          pAVar7 = Abc_NtkCreateNode(pNtkNew);
          Abc_ObjAddFanin(pAVar7,(pAVar8->field_6).pCopy);
          pcVar6 = "0 1\n";
          if ((*(uint *)&pAVar5->field_0x14 >> 10 & 1) == 0) {
            pcVar6 = "1 1\n";
          }
          pcVar6 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,pcVar6);
          (pAVar7->field_5).pData = pcVar6;
          pAVar5 = (pAVar5->field_6).pCopy;
          goto LAB_0022a558;
        }
        pAVar7 = Abc_AigConst1(pNtk);
        pFanin = Abc_NtkCreateNode(pNtkNew);
        if (pAVar8 == pAVar7) {
          pcVar6 = " 0\n";
          if ((*(uint *)&pAVar5->field_0x14 >> 10 & 1) == 0) {
            pcVar6 = " 1\n";
          }
          pcVar6 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,pcVar6);
          (pFanin->field_5).pData = pcVar6;
        }
        else {
          pVVar4 = Vec_WecEntry(vSupps,iVar11);
          for (iVar1 = 0; iVar1 < pVVar4->nSize; iVar1 = iVar1 + 1) {
            i = Vec_IntEntry(pVVar4,iVar1);
            pAVar8 = Abc_NtkCi(pNtkNew,i);
            Abc_ObjAddFanin(pFanin,pAVar8);
          }
          pvVar9 = Vec_PtrEntry(p_00,iVar11);
          (pFanin->field_5).pData = pvVar9;
          if (pvVar9 == (void *)0x1) {
            __assert_fail("pNodeNew->pData != (void *)(ABC_PTRINT_T)1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCollapse.c"
                          ,0x39e,
                          "Abc_Ntk_t *Abc_NtkFromSopsInt(Abc_Ntk_t *, int, int, int, int, int, int, int)"
                         );
          }
        }
        Abc_ObjAddFanin((pAVar5->field_6).pCopy,pFanin);
      }
    }
    Vec_WecFree(vSupps);
    Vec_PtrFree(p_00);
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromSopsInt( Abc_Ntk_t * pNtk, int nCubeLim, int nBTLimit, int nCostMax, int fCanon, int fReverse, int fCnfShared, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Gia_Man_t * pGia;
    Vec_Wec_t * vSupps;
    Vec_Int_t * vSupp;
    Vec_Ptr_t * vSops;
    Abc_Obj_t * pNode, * pNodeNew, * pDriver;
    int i, k, iCi; 
    pGia    = Abc_NtkClpGia( pNtk );
    vSupps  = Gia_ManCreateCoSupps( pGia, fVerbose );
    // check the largest output
    if ( nCubeLim > 0 && nCostMax > 0 )
    {
        int iCoMax   = Gia_ManCoLargestSupp( pGia, vSupps );
        int iObjMax  = Gia_ObjId( pGia, Gia_ManCo(pGia, iCoMax) );
        int nSuppMax = Vec_IntSize( Vec_WecEntry(vSupps, iCoMax) );
        int nNodeMax = Gia_ManConeSize( pGia, &iObjMax, 1 );
        word Cost = (word)nNodeMax * (word)nSuppMax * (word)nCubeLim;
        if ( Cost > (word)nCostMax )
        {
            printf( "Cost of the largest output cone exceeded the limit (%d * %d * %d  >  %d).\n", 
                nNodeMax, nSuppMax, nCubeLim, nCostMax );
            Gia_ManStop( pGia );
            Vec_WecFree( vSupps );
            return NULL;
        }
    }
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    vSops   = Abc_GiaDeriveSops( pNtkNew, pGia, vSupps, nCubeLim, nBTLimit, nCostMax, fCanon, fReverse, fCnfShared, fVerbose );
    Gia_ManStop( pGia );
    if ( vSops == NULL )
    {
        Vec_WecFree( vSupps );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjIsCi(pDriver) && !strcmp(Abc_ObjName(pNode), Abc_ObjName(pDriver)) )
        {
            Abc_ObjAddFanin( pNode->pCopy, pDriver->pCopy );
            continue;
        }
        if ( Abc_ObjIsCi(pDriver) )
        {
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            Abc_ObjAddFanin( pNodeNew, pDriver->pCopy ); 
            pNodeNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_ObjFaninC0(pNode) ? "0 1\n" : "1 1\n" );
            Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
            continue;
        }
        if ( pDriver == Abc_AigConst1(pNtk) )
        {
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            pNodeNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_ObjFaninC0(pNode) ? " 0\n" : " 1\n" );
            Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
            continue;
        }
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        vSupp = Vec_WecEntry( vSupps, i );
        Vec_IntForEachEntry( vSupp, iCi, k )
            Abc_ObjAddFanin( pNodeNew, Abc_NtkCi(pNtkNew, iCi) );
        pNodeNew->pData = Vec_PtrEntry( vSops, i );
        assert( pNodeNew->pData != (void *)(ABC_PTRINT_T)1 );
        Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
    }
    Vec_WecFree( vSupps );
    Vec_PtrFree( vSops );
    return pNtkNew;
}